

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgNameAllocator.cpp
# Opt level: O2

string * __thiscall
rsg::NameAllocator::allocate_abi_cxx11_(string *__return_storage_ptr__,NameAllocator *this)

{
  uint uVar1;
  deUint32 in_EDX;
  
  uVar1 = this->m_nextName;
  this->m_nextName = uVar1 + 1;
  nameNdxToStr_abi_cxx11_(__return_storage_ptr__,(rsg *)(ulong)uVar1,in_EDX);
  return __return_storage_ptr__;
}

Assistant:

std::string NameAllocator::allocate (void)
{
	DE_ASSERT(m_nextName != 0);
	return nameNdxToStr(m_nextName++);
}